

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

bool __thiscall
soplex::SPxBasisBase<double>::readBasis
          (SPxBasisBase<double> *this,istream *is,NameSet *rowNames,NameSet *colNames)

{
  double dVar1;
  double dVar2;
  NameSet *pNVar3;
  bool bVar4;
  Status SVar5;
  int iVar6;
  uint uVar7;
  uint i;
  Type TVar8;
  double *pdVar9;
  SPxSolverBase<double> *pSVar10;
  char cVar11;
  ulong uVar12;
  long lVar13;
  NameSet *p_rowNames;
  NameSet *p_colNames;
  DataKey key;
  stringstream name;
  NameSet *local_440;
  NameSet *local_438;
  double local_430;
  Desc local_428;
  DataKey local_3e8;
  DataKey local_3e0;
  NameSet *local_3d8;
  NameSet *local_3d0;
  double local_3c8;
  undefined8 uStack_3c0;
  NameSet *local_3b8;
  istream *local_3b0;
  double local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_390 [16];
  istream *local_380;
  undefined8 local_378;
  undefined2 local_370;
  ios_base local_310 [168];
  char *local_268;
  char *pcStack_260;
  char *local_258;
  char *pcStack_250;
  char *local_248;
  char *pcStack_240;
  char local_238;
  char local_138;
  undefined2 local_38;
  int local_34;
  
  local_438 = (NameSet *)0x0;
  local_440 = (NameSet *)0x0;
  local_3d8 = colNames;
  local_3d0 = rowNames;
  local_3b8 = colNames;
  local_3b0 = is;
  if (colNames == (NameSet *)0x0) {
    uVar7 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
            super_SVSetBase<double>.set.thenum;
    std::__cxx11::stringstream::stringstream((stringstream *)local_390);
    spx_alloc<soplex::NameSet*>(&local_438,1);
    pNVar3 = local_438;
    NameSet::NameSet(local_438,10000,-1,2.0,2.0);
    local_438 = pNVar3;
    NameSet::reMax(pNVar3,uVar7);
    if (0 < (int)uVar7) {
      uVar12 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_380,"x",1);
        std::ostream::operator<<((ostream *)&local_380,(int)uVar12);
        local_3e0 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                    super_SVSetBase<double>.set.thekey[uVar12];
        SPxColId::SPxColId((SPxColId *)&local_428,&local_3e0);
        pNVar3 = local_438;
        local_3e8.info = local_428.rowstat.thesize;
        local_3e8.idx = local_428.rowstat.themax;
        std::__cxx11::stringbuf::str();
        NameSet::add(pNVar3,&local_3e8,(char *)local_428.rowstat._0_8_);
        rowNames = local_3d0;
        if ((DataKey *)local_428.rowstat._0_8_ != (DataKey *)&local_428.rowstat.memFactor) {
          operator_delete((void *)local_428.rowstat._0_8_,(long)local_428.rowstat.memFactor + 1);
        }
        uVar12 = uVar12 + 1;
      } while (uVar7 != uVar12);
    }
    local_3d8 = local_438;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_390);
    std::ios_base::~ios_base(local_310);
  }
  if (rowNames == (NameSet *)0x0) {
    uVar7 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
            super_SVSetBase<double>.set.thenum;
    std::__cxx11::stringstream::stringstream((stringstream *)local_390);
    spx_alloc<soplex::NameSet*>(&local_440,1);
    pNVar3 = local_440;
    NameSet::NameSet(local_440,10000,-1,2.0,2.0);
    local_440 = pNVar3;
    NameSet::reMax(pNVar3,uVar7);
    if (0 < (int)uVar7) {
      uVar12 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_380,"C",1);
        std::ostream::operator<<((ostream *)&local_380,(int)uVar12);
        local_3e0 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set.thekey[uVar12];
        SPxRowId::SPxRowId((SPxRowId *)&local_428,&local_3e0);
        pNVar3 = local_440;
        local_3e8.info = local_428.rowstat.thesize;
        local_3e8.idx = local_428.rowstat.themax;
        std::__cxx11::stringbuf::str();
        NameSet::add(pNVar3,&local_3e8,(char *)local_428.rowstat._0_8_);
        if ((DataKey *)local_428.rowstat._0_8_ != (DataKey *)&local_428.rowstat.memFactor) {
          operator_delete((void *)local_428.rowstat._0_8_,(long)local_428.rowstat.memFactor + 1);
        }
        uVar12 = uVar12 + 1;
      } while (uVar7 != uVar12);
    }
    rowNames = local_440;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_390);
    std::ios_base::~ios_base(local_310);
  }
  if (this->thestatus == NO_PROBLEM) {
    (*this->_vptr_SPxBasisBase[7])(this,this->theLP,0);
  }
  Desc::Desc(&local_428,&this->thedesc);
  pSVar10 = this->theLP;
  if (0 < (pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    lVar13 = 0;
    do {
      SVar5 = dualRowStatus(this,(int)lVar13);
      local_428.rowstat.data[lVar13] = SVar5;
      lVar13 = lVar13 + 1;
      pSVar10 = this->theLP;
    } while (lVar13 < (pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  if (0 < (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    pdVar9 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_3a8 = *pdVar9;
    uStack_3a0 = 0;
    local_3c8 = -local_3a8;
    uStack_3c0 = 0x8000000000000000;
    lVar13 = 0;
    do {
      dVar1 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar13];
      dVar2 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar13];
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        local_430 = dVar1;
        ::soplex::infinity::__tls_init();
        pSVar10 = this->theLP;
        if (local_430 <= local_3c8) {
          local_430 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar13];
          ::soplex::infinity::__tls_init();
          if (local_3a8 <= local_430) {
            local_428.colstat.data[lVar13] = P_FREE;
            goto LAB_001e8366;
          }
          pSVar10 = this->theLP;
        }
        local_430 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13];
        ::soplex::infinity::__tls_init();
        if (local_430 <= local_3c8) {
          local_428.colstat.data[lVar13] = P_ON_UPPER;
        }
        else {
          local_428.colstat.data[lVar13] = P_ON_LOWER;
        }
      }
      else {
        local_428.colstat.data[lVar13] = P_FIXED;
      }
LAB_001e8366:
      lVar13 = lVar13 + 1;
      pSVar10 = this->theLP;
    } while (lVar13 < (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  local_390._0_8_ = &PTR__MPSInput_003aea20;
  local_390._8_4_ = NAME;
  local_380 = local_3b0;
  local_378._0_4_ = 0;
  local_378._4_4_ = MINIMIZE;
  local_370._0_1_ = false;
  local_370._1_1_ = '\0';
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  local_34 = 0;
  local_138 = '\0';
  local_268 = (char *)0x0;
  pcStack_260 = (char *)0x0;
  local_258 = (char *)0x0;
  pcStack_250 = (char *)0x0;
  local_248 = (char *)0x0;
  pcStack_240 = (char *)0x0;
  local_238 = '\0';
  bVar4 = MPSInput::readLine((MPSInput *)local_390);
  pNVar3 = local_3d0;
  if (((bVar4) && (local_268 != (char *)0x0)) && (iVar6 = strcmp(local_268,"NAME"), iVar6 == 0)) {
    while (bVar4 = MPSInput::readLine((MPSInput *)local_390), bVar4) {
      if ((local_268 != (char *)0x0) && (iVar6 = strcmp(local_268,"ENDATA"), iVar6 == 0)) {
        local_390._8_4_ = ENDATA;
        break;
      }
      if (((pcStack_260 == (char *)0x0) || (local_258 == (char *)0x0)) ||
         (uVar7 = NameSet::number(local_3d8,local_258), (int)uVar7 < 0)) break;
      cVar11 = *pcStack_260;
      if (cVar11 == 'X') {
        if ((pcStack_250 == (char *)0x0) || (i = NameSet::number(rowNames,pcStack_250), (int)i < 0))
        break;
        cVar11 = *pcStack_260;
        if (cVar11 != 'X') goto LAB_001e86f3;
        if ((pcStack_260[1] == 'U') && (pcStack_260[2] == '\0')) {
          SVar5 = dualColStatus(this,uVar7);
          local_428.colstat.data[uVar7] = SVar5;
          TVar8 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,i);
          if (TVar8 == GREATER_EQUAL) {
            local_428.rowstat.data[i] = P_ON_LOWER;
          }
          else {
            TVar8 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,i);
            if (TVar8 == EQUAL) {
LAB_001e86e7:
              local_428.rowstat.data[i] = P_FIXED;
            }
            else {
              local_428.rowstat.data[i] = P_ON_UPPER;
            }
          }
        }
        else {
          if ((pcStack_260[1] != 'L') || (pcStack_260[2] != '\0')) {
LAB_001e87d8:
            MPSInput::syntaxError((MPSInput *)local_390);
            break;
          }
          SVar5 = dualColStatus(this,uVar7);
          local_428.colstat.data[uVar7] = SVar5;
          TVar8 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,i);
          if (TVar8 == LESS_EQUAL) {
            local_428.rowstat.data[i] = P_ON_UPPER;
          }
          else {
            TVar8 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,i);
            if (TVar8 == EQUAL) goto LAB_001e86e7;
            local_428.rowstat.data[i] = P_ON_LOWER;
          }
        }
      }
      else {
LAB_001e86f3:
        if (cVar11 == 'L') {
          if ((pcStack_260[1] != 'L') || (pcStack_260[2] != '\0')) goto LAB_001e87d8;
          local_428.colstat.data[uVar7] = P_ON_LOWER;
        }
        else {
          if (((cVar11 != 'U') || (pcStack_260[1] != 'L')) || (pcStack_260[2] != '\0'))
          goto LAB_001e87d8;
          local_428.colstat.data[uVar7] = P_ON_UPPER;
        }
      }
    }
  }
  if (local_370._0_1_ == false) {
    if (local_390._8_4_ == ENDATA) {
      if (this->thestatus != REGULAR) {
        this->thestatus = REGULAR;
      }
      (*this->_vptr_SPxBasisBase[5])(this,(DataKey *)&local_428);
    }
    else {
      MPSInput::syntaxError((MPSInput *)local_390);
    }
  }
  if (pNVar3 == (NameSet *)0x0) {
    NameSet::~NameSet(local_440);
    free(local_440);
    local_440 = (NameSet *)0x0;
  }
  if (local_3b8 == (NameSet *)0x0) {
    NameSet::~NameSet(local_438);
    free(local_438);
    local_438 = (NameSet *)0x0;
  }
  bVar4 = local_370._0_1_;
  if (local_428.colstat.data != (Status *)0x0) {
    free(local_428.colstat.data);
    local_428.colstat.data = (Status *)0x0;
  }
  if (local_428.rowstat.data != (Status *)0x0) {
    free(local_428.rowstat.data);
  }
  return (bool)(bVar4 ^ 1);
}

Assistant:

bool SPxBasisBase<R>::readBasis(
   std::istream&  is,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   assert(theLP != nullptr);

   /* prepare names */
   const NameSet* rNames = rowNames;
   const NameSet* cNames = colNames;

   NameSet* p_colNames = nullptr;
   NameSet* p_rowNames = nullptr;

   if(colNames == nullptr)
   {
      int nCols = theLP->nCols();
      std::stringstream name;

      spx_alloc(p_colNames);
      p_colNames = new(p_colNames) NameSet();
      p_colNames->reMax(nCols);

      for(int j = 0; j < nCols; ++j)
      {
         name << "x" << j;
         DataKey key = theLP->colId(j);
         p_colNames->add(key, name.str().c_str());
      }

      cNames = p_colNames;
   }

   if(rNames == nullptr)
   {
      int nRows = theLP->nRows();
      std::stringstream name;

      spx_alloc(p_rowNames);
      p_rowNames = new(p_rowNames) NameSet();
      p_rowNames->reMax(nRows);

      for(int i = 0; i < nRows; ++i)
      {
         name << "C" << i;
         DataKey key = theLP->rowId(i);
         p_rowNames->add(key, name.str().c_str());
      }

      rNames = p_rowNames;
   }

   /* load default basis if necessary */
   if(status() == NO_PROBLEM)
      load(theLP, false);

   /* initialize with standard settings */
   Desc l_desc(thedesc);

   for(int i = 0; i < theLP->nRows(); i++)
      l_desc.rowstat[i] = dualRowStatus(i);

   for(int i = 0; i < theLP->nCols(); i++)
   {
      if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         l_desc.colstat[i] = Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity)
              && theLP->SPxLPBase<R>::upper(i) >= R(infinity))
         l_desc.colstat[i] = Desc::P_FREE;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity))
         l_desc.colstat[i] = Desc::P_ON_UPPER;
      else
         l_desc.colstat[i] = Desc::P_ON_LOWER;
   }

   MPSInput mps(is);

   if(mps.readLine() && (mps.field0() != nullptr) && !strcmp(mps.field0(), "NAME"))
   {
      while(mps.readLine())
      {
         int c = -1;
         int r = -1;

         if((mps.field0() != nullptr) && !strcmp(mps.field0(), "ENDATA"))
         {
            mps.setSection(MPSInput::ENDATA);
            break;
         }

         if((mps.field1() == nullptr) || (mps.field2() == nullptr))
            break;

         if((c = cNames->number(mps.field2())) < 0)
            break;

         if(*mps.field1() == 'X')
            if(mps.field3() == nullptr || (r = rNames->number(mps.field3())) < 0)
               break;

         if(!strcmp(mps.field1(), "XU"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::GREATER_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "XL"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::LESS_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
         }
         else if(!strcmp(mps.field1(), "UL"))
         {
            l_desc.colstat[c] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "LL"))
         {
            l_desc.colstat[c] = Desc::P_ON_LOWER;
         }
         else
         {
            mps.syntaxError();
            break;
         }
      }
   }

   if(!mps.hasError())
   {
      if(mps.section() == MPSInput::ENDATA)
      {
         // force basis to be different from NO_PROBLEM
         // otherwise the basis will be overwritten at later stages.
         setStatus(REGULAR);
         loadDesc(l_desc);
      }
      else
         mps.syntaxError();
   }

   if(rowNames == nullptr)
   {
      p_rowNames->~NameSet();
      spx_free(p_rowNames);
   }

   if(colNames == nullptr)
   {
      p_colNames->~NameSet();
      spx_free(p_colNames);
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());
#endif

   return !mps.hasError();
}